

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

void __thiscall
pbrt::Cylinder::Cylinder
          (Cylinder *this,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,Float radius,Float zMin,Float zMax,Float phiMax)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  float deg;
  Float FVar3;
  float in_XMM3_Da;
  Transform *in_stack_00000110;
  float local_28;
  float local_24;
  undefined4 local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(byte *)(in_RDI + 2) = local_19;
  local_20 = in_XMM0_Da;
  bVar1 = Transform::SwapsHandedness(in_stack_00000110);
  *(bool *)((long)in_RDI + 0x11) = bVar1;
  *(undefined4 *)((long)in_RDI + 0x14) = local_20;
  pfVar2 = std::min<float>(&local_24,&local_28);
  *(float *)(in_RDI + 3) = *pfVar2;
  pfVar2 = std::max<float>(&local_24,&local_28);
  *(float *)((long)in_RDI + 0x1c) = *pfVar2;
  deg = Clamp<float,int,int>(in_XMM3_Da,0,0x168);
  FVar3 = Radians(deg);
  *(Float *)(in_RDI + 4) = FVar3;
  return;
}

Assistant:

inline Cylinder::Cylinder(const Transform *renderFromObject,
                          const Transform *objectFromRender, bool reverseOrientation,
                          Float radius, Float zMin, Float zMax, Float phiMax)
    : renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()),
      radius(radius),
      zMin(std::min(zMin, zMax)),
      zMax(std::max(zMin, zMax)),
      phiMax(Radians(Clamp(phiMax, 0, 360))) {}